

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

InternalParseResult * __thiscall
Catch::Clara::Opt::parse
          (InternalParseResult *__return_storage_ptr__,Opt *this,string *param_1,TokenStream *tokens
          )

{
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pTVar3;
  pointer pTVar4;
  element_type *peVar5;
  char *pcVar6;
  StringRef *pSVar7;
  bool bVar8;
  int iVar9;
  pointer pTVar10;
  size_type in_R9;
  StringRef lhs;
  StringRef lhs_00;
  StringRef rhs;
  StringRef rhs_00;
  Result validationResult;
  undefined1 local_c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char *local_90;
  char *local_88;
  long *local_80 [2];
  long local_70 [2];
  BasicResult<void> local_60;
  
  (*(this->super_ParserRefImpl<Catch::Clara::Opt>).super_ComposableParserImpl<Catch::Clara::Opt>.
    super_ParserBase._vptr_ParserBase[2])(&local_60);
  if (local_60.super_ResultValueBase<void>.super_ResultBase.m_type != Ok) {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&local_60);
    goto LAB_0014381b;
  }
  pvVar1 = &tokens->m_tokenBuffer;
  pTVar3 = (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar4 = (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((pTVar3 == pTVar4) && ((tokens->it)._M_current == (tokens->itEnd)._M_current)) ||
     (pTVar3->type != Option)) {
LAB_001437ce:
    pTVar10 = (tokens->m_tokenBuffer).
              super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (tokens->m_tokenBuffer).
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pvVar1->
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (tokens->m_tokenBuffer).
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
    super_ResultBase.m_type = Ok;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_type = NoMatch;
    pSVar7 = (tokens->itEnd)._M_current;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_remainingTokens.it._M_current = (tokens->it)._M_current;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_remainingTokens.itEnd._M_current = pSVar7;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
             field_0 + 0x18) = pTVar3;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_remainingTokens.m_tokenBuffer.
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_finish = pTVar4;
  }
  else {
    local_90 = (pTVar3->token).m_start;
    local_88 = (char *)(pTVar3->token).m_size;
    bVar8 = isMatch(this,pTVar3->token);
    if (!bVar8) goto LAB_001437ce;
    iVar9 = (*((this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->_vptr_BoundRef[3])();
    peVar5 = (this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
             super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((char)iVar9 == '\0') {
      Detail::TokenStream::operator++(tokens);
      pTVar3 = (tokens->m_tokenBuffer).
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pTVar3 == (tokens->m_tokenBuffer).
                     super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                     ._M_impl.super__Vector_impl_data._M_finish) &&
         ((tokens->it)._M_current == (tokens->itEnd)._M_current)) {
        lhs.m_size = (size_type)local_90;
        lhs.m_start = (char *)0x1c;
        rhs.m_size = in_R9;
        rhs.m_start = local_88;
        operator+[abi_cxx11_((string *)local_c0,(Catch *)"Expected argument following ",lhs,rhs);
      }
      else {
        if (pTVar3->type == Argument) {
          pcVar6 = (pTVar3->token).m_start;
          local_80[0] = local_70;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_80,pcVar6,pcVar6 + (pTVar3->token).m_size);
          (*peVar5->_vptr_BoundRef[4])(local_c0,peVar5,local_80);
          if (local_80[0] != local_70) {
            operator_delete(local_80[0],local_70[0] + 1);
          }
          if (local_c0._8_4_ == Ok) {
            (**(_func_int **)(local_c0._0_8_ + 0x10))();
            if (local_c0._12_4_ != ShortCircuitAll) goto LAB_00143a32;
            (**(_func_int **)(local_c0._0_8_ + 0x10))();
            goto LAB_00143929;
          }
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::
          BasicResult<Catch::Clara::ParseResultType>
                    (__return_storage_ptr__,(BasicResult<Catch::Clara::ParseResultType> *)local_c0);
          goto LAB_00143977;
        }
        lhs_00.m_size = (size_type)local_90;
        lhs_00.m_start = (char *)0x1c;
        rhs_00.m_size = in_R9;
        rhs_00.m_start = local_88;
        operator+[abi_cxx11_
                  ((string *)local_c0,(Catch *)"Expected argument following ",lhs_00,rhs_00);
      }
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase.m_type = RuntimeError;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1450;
      paVar2 = &(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar2;
      if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
        paVar2->_M_allocated_capacity = local_c0._16_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
             local_c0._24_8_;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)local_c0._0_8_;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = local_c0._16_8_;
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length =
           CONCAT44(local_c0._12_4_,local_c0._8_4_);
      goto LAB_0014381b;
    }
    (*peVar5->_vptr_BoundRef[4])(local_c0,peVar5,1);
    if (local_c0._8_4_ != Ok) {
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::
      BasicResult<Catch::Clara::ParseResultType>
                (__return_storage_ptr__,(BasicResult<Catch::Clara::ParseResultType> *)local_c0);
LAB_00143977:
      local_c0._0_8_ = &PTR__BasicResult_001b1540;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._16_8_ != &local_a0) {
        operator_delete((void *)local_c0._16_8_,local_a0._M_allocated_capacity + 1);
      }
      goto LAB_0014381b;
    }
    (**(_func_int **)(local_c0._0_8_ + 0x10))();
    if (local_c0._12_4_ == ShortCircuitAll) {
      (**(_func_int **)(local_c0._0_8_ + 0x10))();
LAB_00143929:
      pTVar3 = (tokens->m_tokenBuffer).
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pTVar4 = (tokens->m_tokenBuffer).
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = (tokens->m_tokenBuffer).
                super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      (tokens->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pvVar1->
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>)
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (tokens->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase.m_type = Ok;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_type = local_c0._12_4_;
      pSVar7 = (tokens->itEnd)._M_current;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_remainingTokens.it._M_current = (tokens->it)._M_current;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_remainingTokens.itEnd._M_current = pSVar7;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_remainingTokens.m_tokenBuffer.
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_start = pTVar4;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_remainingTokens.m_tokenBuffer.
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish = pTVar10;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_remainingTokens.m_tokenBuffer.
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar3;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1450;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
      goto LAB_00143977;
    }
LAB_00143a32:
    local_c0._0_8_ = &PTR__BasicResult_001b1540;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._16_8_ != &local_a0) {
      operator_delete((void *)local_c0._16_8_,local_a0._M_allocated_capacity + 1);
    }
    Detail::TokenStream::operator++(tokens);
    pTVar10 = (tokens->m_tokenBuffer).
              super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pTVar3 = (tokens->m_tokenBuffer).
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar4 = (tokens->m_tokenBuffer).
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (tokens->m_tokenBuffer).
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pvVar1->
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (tokens->m_tokenBuffer).
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
    super_ResultBase.m_type = Ok;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_type = Matched;
    pSVar7 = (tokens->itEnd)._M_current;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_remainingTokens.it._M_current = (tokens->it)._M_current;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_remainingTokens.itEnd._M_current = pSVar7;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_remainingTokens.m_tokenBuffer.
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_start = pTVar3;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_remainingTokens.m_tokenBuffer.
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_finish = pTVar4;
  }
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.m_value.
  m_remainingTokens.m_tokenBuffer.
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar10;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b1450;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0014381b:
  local_60.super_ResultValueBase<void>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001b15c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_errorMessage._M_dataplus._M_p != &local_60.m_errorMessage.field_2) {
    operator_delete(local_60.m_errorMessage._M_dataplus._M_p,
                    local_60.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult Opt::parse(std::string const&,
                                       Detail::TokenStream tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            if (tokens &&
                tokens->type == Detail::TokenType::Option) {
                auto const& token = *tokens;
                if (isMatch(token.token)) {
                    if (m_ref->isFlag()) {
                        auto flagRef =
                            static_cast<Detail::BoundFlagRefBase*>(
                                m_ref.get());
                        auto result = flagRef->setFlag(true);
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), CATCH_MOVE(tokens)));
                    } else {
                        auto valueRef =
                            static_cast<Detail::BoundValueRefBase*>(
                                m_ref.get());
                        ++tokens;
                        if (!tokens)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        auto const& argToken = *tokens;
                        if (argToken.type != Detail::TokenType::Argument)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        const auto result = valueRef->setValue(static_cast<std::string>(argToken.token));
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), CATCH_MOVE(tokens)));
                    }
                    return Detail::InternalParseResult::ok(Detail::ParseState(
                        ParseResultType::Matched, CATCH_MOVE(++tokens)));
                }
            }
            return Detail::InternalParseResult::ok(
                Detail::ParseState(ParseResultType::NoMatch, CATCH_MOVE(tokens)));
        }